

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyBQ2Div(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  Node *pNVar1;
  Stack *stack;
  uint uVar2;
  tmbchar indent_buf [32];
  
  stack = prvTidynewStack(doc,0x10);
  while (node != (Node *)0x0) {
    node_00 = node->next;
    if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_BLOCKQUOTE)) &&
       (node->implicit != no)) {
      uVar2 = 2;
      while( true ) {
        pNVar1 = node->content;
        if (((pNVar1 == (Node *)0x0) || (pNVar1->next != (Node *)0x0)) ||
           ((pNVar1->tag == (Dict *)0x0 ||
            ((pNVar1->tag->id != TidyTag_BLOCKQUOTE || (node->implicit == no)))))) break;
        StripOnlyChild(doc,node);
        uVar2 = uVar2 + 2;
      }
      prvTidytmbsnprintf(indent_buf,0x20,"margin-left: %dem",(ulong)uVar2);
      RenameElem(doc,node,TidyTag_DIV);
      prvTidyAddStyleProperty(doc,node,indent_buf);
    }
    if (node->content == (Node *)0x0) {
      node = node_00;
      if (node_00 == (Node *)0x0) {
        node = prvTidypop(stack);
      }
    }
    else {
      prvTidypush(stack,node_00);
      node = node->content;
    }
  }
  prvTidyfreeStack(stack);
  return;
}

Assistant:

void TY_(BQ2Div)( TidyDocImpl* doc, Node *node )
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node *next;
    
    tmbchar indent_buf[ 32 ];
    uint indent;

    while (node)
    {
        next = node->next;
        
        if ( nodeIsBLOCKQUOTE(node) && node->implicit )
        {
            indent = 1;

            while( HasOneChild(node) &&
                   nodeIsBLOCKQUOTE(node->content) &&
                   node->implicit)
            {
                ++indent;
                StripOnlyChild( doc, node );
            }

            TY_(tmbsnprintf)(indent_buf, sizeof(indent_buf), "margin-left: %dem",
                             2*indent);

            RenameElem( doc, node, TidyTag_DIV );
            TY_(AddStyleProperty)(doc, node, indent_buf );

            if (node->content)
            {
                TY_(push)(stack, next);
                node = node->content;
                continue;
            }
        }
        else if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}